

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset_props.cpp
# Opt level: O0

int32_t uset_applyPattern_63
                  (USet *set,UChar *pattern,int32_t patternLength,uint32_t options,
                  UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  undefined1 local_80 [8];
  ParsePosition pos;
  UnicodeString pat;
  UErrorCode *status_local;
  uint32_t options_local;
  int32_t patternLength_local;
  UChar *pattern_local;
  USet *set_local;
  
  if ((status != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*status), UVar1 == '\0')) {
    if (set == (USet *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return 0;
    }
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&pos.index,pattern,patternLength);
    icu_63::ParsePosition::ParsePosition((ParsePosition *)local_80);
    icu_63::UnicodeSet::applyPattern
              ((UnicodeSet *)set,(UnicodeString *)&pos.index,(ParsePosition *)local_80,options,
               (SymbolTable *)0x0,status);
    iVar2 = icu_63::ParsePosition::getIndex((ParsePosition *)local_80);
    icu_63::ParsePosition::~ParsePosition((ParsePosition *)local_80);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&pos.index);
    return iVar2;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2 
uset_applyPattern(USet *set,
                  const UChar *pattern, int32_t patternLength,
                  uint32_t options,
                  UErrorCode *status){

    // status code needs to be checked since we 
    // dereference it
    if(status == NULL || U_FAILURE(*status)){
        return 0;
    }

    // check only the set paramenter
    // if pattern is NULL or null terminate
    // UnicodeString constructor takes care of it
    if(set == NULL){
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    UnicodeString pat(pattern, patternLength);

    ParsePosition pos;
   
    ((UnicodeSet*) set)->applyPattern(pat, pos, options, NULL, *status);
    
    return pos.getIndex();
}